

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

void __thiscall ON_V4V5_MeshNgonUserData::ON_V4V5_MeshNgonUserData(ON_V4V5_MeshNgonUserData *this)

{
  ON_UUID OVar1;
  
  ON_UserData::ON_UserData(&this->super_ON_UserData);
  (this->super_ON_UserData).super_ON_Object._vptr_ON_Object = (_func_int **)&PTR_ClassId_00814d98;
  OVar1 = ON_ClassId::Uuid(&m_ON_V4V5_MeshNgonUserData_class_rtti);
  (this->super_ON_UserData).m_userdata_uuid = OVar1;
  (this->super_ON_UserData).m_application_uuid.Data1 = 0x17b3ecda;
  (this->super_ON_UserData).m_application_uuid.Data2 = 0x17ba;
  (this->super_ON_UserData).m_application_uuid.Data3 = 0x4e45;
  (this->super_ON_UserData).m_application_uuid.Data4[0] = 0x9e;
  (this->super_ON_UserData).m_application_uuid.Data4[1] = 'g';
  (this->super_ON_UserData).m_application_uuid.Data4[2] = 0xa2;
  (this->super_ON_UserData).m_application_uuid.Data4[3] = 0xb8;
  (this->super_ON_UserData).m_application_uuid.Data4[4] = 0xd9;
  (this->super_ON_UserData).m_application_uuid.Data4[5] = 0xbe;
  (this->super_ON_UserData).m_application_uuid.Data4[6] = 'R';
  (this->super_ON_UserData).m_application_uuid.Data4[7] = '\r';
  (this->super_ON_UserData).m_userdata_copycount = 1;
  this->m_ngon_list = (ON_V4V5_MeshNgonList *)0x0;
  this->m_mesh_F_count = 0;
  this->m_mesh_V_count = 0;
  return;
}

Assistant:

ON_V4V5_MeshNgonUserData::ON_V4V5_MeshNgonUserData()
{
  m_userdata_uuid = ON_CLASS_ID(ON_V4V5_MeshNgonUserData);
  m_application_uuid = ON_opennurbs4_id;
  m_userdata_copycount = 1;
  m_ngon_list = 0;
  m_mesh_F_count = 0;
  m_mesh_V_count = 0;
}